

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tsgGridSequence.cpp
# Opt level: O2

void __thiscall
TasGrid::GridSequence::evalHierarchicalFunctions(GridSequence *this,double *x,double *fvalues)

{
  uint uVar1;
  int iVar2;
  long lVar3;
  long lVar4;
  ulong uVar5;
  ulong uVar6;
  pointer pvVar7;
  long lVar8;
  long lVar9;
  ulong uVar10;
  double dVar11;
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  cache;
  
  lVar9 = 0x18;
  if ((this->super_BaseCanonicalGrid).points.indexes.super__Vector_base<int,_std::allocator<int>_>.
      _M_impl.super__Vector_impl_data._M_start ==
      (this->super_BaseCanonicalGrid).points.indexes.super__Vector_base<int,_std::allocator<int>_>.
      _M_impl.super__Vector_impl_data._M_finish) {
    lVar9 = 0x40;
  }
  uVar1 = *(uint *)((long)&(this->super_BaseCanonicalGrid).acceleration + lVar9);
  cacheBasisValues<double>(&cache,this,x);
  uVar5 = 0;
  uVar10 = (ulong)uVar1;
  if ((int)uVar1 < 1) {
    uVar10 = uVar5;
  }
  iVar2 = (this->super_BaseCanonicalGrid).num_dimensions;
  for (uVar6 = 0; uVar6 != uVar10; uVar6 = uVar6 + 1) {
    lVar3 = *(long *)((long)&(this->super_BaseCanonicalGrid)._vptr_BaseCanonicalGrid + lVar9);
    lVar4 = *(long *)((long)&(this->super_BaseCanonicalGrid).num_dimensions + lVar9);
    dVar11 = ((cache.
               super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start)->
             super__Vector_base<double,_std::allocator<double>_>)._M_impl.super__Vector_impl_data.
             _M_start[*(int *)(lVar4 + lVar3 * uVar6 * 4)];
    fvalues[uVar6] = dVar11;
    pvVar7 = cache.
             super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    for (lVar8 = 1; pvVar7 = pvVar7 + 1, lVar8 < iVar2; lVar8 = lVar8 + 1) {
      dVar11 = dVar11 * (pvVar7->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                        super__Vector_impl_data._M_start
                        [*(int *)(lVar3 * uVar5 + lVar4 + lVar8 * 4)];
      fvalues[uVar6] = dVar11;
    }
    uVar5 = uVar5 + 4;
  }
  ::std::
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  ::~vector((vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
             *)&cache);
  return;
}

Assistant:

void GridSequence::evalHierarchicalFunctions(const double x[], double fvalues[]) const{
    const MultiIndexSet& work = (points.empty()) ? needed : points;
    int num_points = work.getNumIndexes();

    std::vector<std::vector<double>> cache = cacheBasisValues<double>(x);

    for(int i=0; i<num_points; i++){
        const int* p = work.getIndex(i);
        fvalues[i] = cache[0][p[0]];
        for(int j=1; j<num_dimensions; j++){
            fvalues[i] *= cache[j][p[j]];
        }
    }
}